

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_cluster_ping(intptr_t uuid,fio_protocol_s *pr_)

{
  uintptr_t *puVar1;
  fio_str_info_s ch;
  fio_write_args_s options;
  fio_str_info_s data;
  fio_msg_internal_s *ptr;
  size_t sVar2;
  size_t sVar3;
  uint in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff64;
  char *in_stack_ffffffffffffff68;
  undefined8 in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  fio_msg_internal_s *local_78;
  code *pcStack_70;
  size_t local_68;
  char *pcStack_60;
  ulong local_58;
  size_t sStack_50;
  char *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 local_30;
  
  ch.len._0_4_ = 1;
  ch.capa = (ulong)in_stack_ffffffffffffff5c << 0x20;
  ch.len._4_4_ = in_stack_ffffffffffffff64;
  ch.data = in_stack_ffffffffffffff68;
  data.len = in_stack_ffffffffffffff78;
  data.capa = in_stack_ffffffffffffff70;
  data.data = in_stack_ffffffffffffff80;
  ptr = fio_msg_internal_create(0,10,ch,data,'\0','\0');
  LOCK();
  ptr->ref = ptr->ref + 1;
  UNLOCK();
  pcStack_70 = fio_msg_internal_free2;
  local_68 = (ptr->data).len + 0x12 + (ptr->channel).len;
  pcStack_60 = (char *)(ptr->meta_len * 0x18 + 0x48);
  local_58 = local_58 & 0xfffffffffffffff0;
  options.after._0_4_ = 0x13bef0;
  options.data.buffer = ptr;
  options.after._4_4_ = 0;
  options.length = local_68;
  options.offset = (uintptr_t)pcStack_60;
  options._32_8_ = local_58;
  local_78 = ptr;
  fio_write2_fn(uuid,options);
  LOCK();
  puVar1 = &ptr->ref;
  *puVar1 = *puVar1 - 1;
  UNLOCK();
  if (*puVar1 == 0) {
    if (ptr->meta_len != 0) {
      sVar3 = ptr->meta_len;
      do {
        sVar2 = sVar3 - 1;
        ptr->meta_len = sVar2;
        if (*(code **)(&ptr->filter + sVar3 * 6) != (code *)0x0) {
          local_78 = (fio_msg_internal_s *)((ulong)local_78 & 0xffffffff00000000);
          pcStack_60 = (ptr->channel).data;
          pcStack_70 = (code *)(ptr->channel).capa;
          local_68 = (ptr->channel).len;
          local_48 = (ptr->data).data;
          local_58 = (ptr->data).capa;
          sStack_50 = (ptr->data).len;
          local_40 = 0;
          uStack_38 = 0;
          local_30 = 0;
          (**(code **)(&ptr->filter + sVar3 * 6))(&local_78,(&ptr->meta_len)[sVar3 * 3]);
          sVar2 = ptr->meta_len;
        }
        sVar3 = sVar2;
      } while (sVar2 != 0);
    }
    fio_free(ptr);
  }
  return;
}

Assistant:

static void fio_cluster_ping(intptr_t uuid, fio_protocol_s *pr_) {
  fio_msg_internal_s *m = fio_msg_internal_create(
      0, FIO_CLUSTER_MSG_PING, (fio_str_info_s){.len = 0},
      (fio_str_info_s){.len = 0}, 0, 1);
  fio_msg_internal_send_dup(uuid, m);
  fio_msg_internal_free(m);
  (void)pr_;
}